

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O2

HRESULT utf8::NarrowStringToWide<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCSTR sourceString,size_t sourceCount,
                  LPWSTR *destStringPtr,charcount_t *destCount,size_t *allocateCount)

{
  ulong uVar1;
  HRESULT HVar2;
  LPWSTR destString;
  
  uVar1 = sourceCount * 2 + 2;
  if (sourceCount <= uVar1) {
    destString = (LPWSTR)(*allocator)(uVar1);
    if (destString != (LPWSTR)0x0) {
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = uVar1;
      }
      *destStringPtr = destString;
      HVar2 = NarrowStringToWideNoAlloc
                        (sourceString,sourceCount,destString,sourceCount + 1,destCount);
      return HVar2;
    }
  }
  return -0x7ff8fff2;
}

Assistant:

HRESULT NarrowStringToWide(_In_ AllocatorFunction allocator,_In_ LPCSTR sourceString,
        size_t sourceCount, _Out_ LPWSTR* destStringPtr, _Out_ charcount_t* destCount, size_t* allocateCount = nullptr)
    {
        size_t cbDestString = (sourceCount + 1) * sizeof(WCHAR);
        if (cbDestString < sourceCount) // overflow ?
        {
            return E_OUTOFMEMORY;
        }

        WCHAR* destString = (WCHAR*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        if (allocateCount != nullptr)
        {
            *allocateCount = cbDestString;
        }

        *destStringPtr = destString;
        return NarrowStringToWideNoAlloc(sourceString, sourceCount, destString, sourceCount + 1, destCount);
    }